

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_construction.h
# Opt level: O0

void ximu::PacketConstruction::
     constructWriteRegisterPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (RegisterData *data,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               dest)

{
  initializer_list<unsigned_char> __l;
  uchar uVar1;
  unsigned_short uVar2;
  RegisterAddresses RVar3;
  iterator iVar4;
  size_type sVar5;
  reference pvVar6;
  iterator end;
  allocator<unsigned_char> local_47;
  uchar local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  RegisterData *data_local;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> dest_local;
  
  local_46 = '\x03';
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)data;
  RVar3 = RegisterData::address(data);
  local_45 = (undefined1)(RVar3 >> 8);
  RVar3 = RegisterData::address
                    ((RegisterData *)
                     decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_44 = (undefined1)RVar3;
  uVar2 = RegisterData::value((RegisterData *)
                              decoded.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_43 = (undefined1)(uVar2 >> 8);
  uVar2 = RegisterData::value((RegisterData *)
                              decoded.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_42 = (undefined1)uVar2;
  local_41 = 0;
  local_40 = &local_46;
  local_38 = 6;
  std::allocator<unsigned_char>::allocator(&local_47);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,__l,&local_47);
  std::allocator<unsigned_char>::~allocator(&local_47);
  iVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  uVar1 = checksum<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )iVar4._M_current,sVar5 - 1);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  *pvVar6 = uVar1;
  iVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  end = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  PacketEncoding::
  encodePacket<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )end._M_current,dest);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

static void constructWriteRegisterPacket(const RegisterData &data,
                                         OutputIterator dest) {
  std::vector<unsigned char> decoded = {
    static_cast<unsigned char>(PacketHeaders::WRITE_REGISTER),
    static_cast<unsigned char>(static_cast<unsigned short>(
        data.address()) >> 8),
    static_cast<unsigned char>(data.address()),
    static_cast<unsigned char>(data.value() >> 8),
    static_cast<unsigned char>(data.value()),
    0 };

  decoded.back() = checksum(decoded.begin(), decoded.size() - 1);
  PacketEncoding::encodePacket(decoded.begin(), decoded.end(), dest);
}